

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestContinuation::ParserTestContinuation(ParserTestContinuation *this)

{
  ParserTestContinuation *this_local;
  
  ParserTest::ParserTest(&this->super_ParserTest);
  (this->super_ParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParserTestContinuation_002a7938;
  return;
}

Assistant:

TEST_F(ParserTest, Continuation) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule link\n"
"  command = foo bar $\n"
"    baz\n"
"\n"
"build a: link c $\n"
" d e f\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("link", rule->name());
  EXPECT_EQ("[foo bar baz]", rule->GetBinding("command")->Serialize());
}